

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int uv_timer_stop(uv_timer_t *handle)

{
  anon_union_24_2_508bea68_for_node *paVar1;
  uint *puVar2;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uint uVar3;
  uv__queue *puVar4;
  uv_loop_t *puVar5;
  heap_node *hb;
  heap_node *phVar6;
  long *plVar7;
  heap_node *phVar8;
  anon_struct_16_2_d918446b_for_timer_heap *paVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  if ((handle->flags & 4) == 0) {
    puVar4 = (handle->node).queue.next;
    ((handle->node).queue.prev)->next = puVar4;
    puVar4->prev = (uv__queue *)(handle->node).heap[1];
  }
  else {
    puVar5 = handle->loop;
    uVar3 = (puVar5->timer_heap).nelts;
    if (uVar3 != 0) {
      heap = &puVar5->timer_heap;
      paVar1 = &handle->node;
      iVar10 = 0;
      uVar11 = 0;
      for (uVar12 = uVar3; paVar9 = heap, 1 < uVar12; uVar12 = uVar12 >> 1) {
        uVar11 = (uVar12 & 1) + uVar11 * 2;
        iVar10 = iVar10 + -1;
      }
      for (; iVar10 != 0; iVar10 = iVar10 + 1) {
        uVar12 = uVar11 * 8;
        uVar11 = uVar11 >> 1;
        paVar9 = (anon_struct_16_2_d918446b_for_timer_heap *)
                 ((ulong)(uVar12 & 8) + (long)paVar9->min);
      }
      (puVar5->timer_heap).nelts = uVar3 - 1;
      hb = (heap_node *)paVar9->min;
      paVar9->min = (void *)0x0;
      if (hb == (heap_node *)paVar1) {
        if ((anon_union_24_2_508bea68_for_node *)heap->min == paVar1) {
          heap->min = (void *)0x0;
        }
      }
      else {
        phVar6 = (heap_node *)(handle->node).heap[0];
        hb->left = phVar6;
        phVar8 = (heap_node *)(handle->node).heap[1];
        hb->right = phVar8;
        hb->parent = (heap_node *)(handle->node).heap[2];
        if (phVar6 != (heap_node *)0x0) {
          phVar6->parent = hb;
          phVar8 = hb->right;
        }
        if (phVar8 != (heap_node *)0x0) {
          phVar8->parent = hb;
        }
        plVar7 = (long *)(handle->node).heap[2];
        paVar9 = heap;
        if (plVar7 != (long *)0x0) {
          paVar9 = (anon_struct_16_2_d918446b_for_timer_heap *)
                   (plVar7 + ((anon_union_24_2_508bea68_for_node *)*plVar7 != paVar1));
        }
        paVar9->min = hb;
        while( true ) {
          phVar6 = hb->left;
          phVar8 = hb;
          if ((phVar6 != (heap_node *)0x0) && (iVar10 = timer_less_than(phVar6,hb), iVar10 != 0)) {
            phVar8 = phVar6;
          }
          phVar6 = hb->right;
          if ((phVar6 != (heap_node *)0x0) && (iVar10 = timer_less_than(phVar6,phVar8), iVar10 != 0)
             ) {
            phVar8 = phVar6;
          }
          if (phVar8 == hb) break;
          heap_node_swap((heap *)heap,hb,phVar8);
        }
        while ((phVar6 = hb->parent, phVar6 != (heap_node *)0x0 &&
               (iVar10 = timer_less_than(hb,phVar6), iVar10 != 0))) {
          heap_node_swap((heap *)heap,phVar6,hb);
        }
      }
    }
    uVar3 = handle->flags;
    if (((uVar3 & 4) != 0) && (handle->flags = uVar3 & 0xfffffffb, (uVar3 & 8) != 0)) {
      puVar2 = &handle->loop->active_handles;
      *puVar2 = *puVar2 - 1;
    }
  }
  (handle->node).heap[0] = &handle->node;
  (handle->node).heap[1] = &handle->node;
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (uv__is_active(handle)) {
    heap_remove((struct heap*) &handle->loop->timer_heap,
                (struct heap_node*) &handle->node.heap,
                timer_less_than);
    uv__handle_stop(handle);
  } else {
    uv__queue_remove(&handle->node.queue);
  }

  uv__queue_init(&handle->node.queue);
  return 0;
}